

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O0

Unique<Type>_conflict11 __thiscall
anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>::load
          (Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_> *this,Model *model,
          Json *source)

{
  const_reference this_00;
  allocator<char> local_71;
  key_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  Ref<anurbs::NurbsSurfaceGeometry<3L>_> geometry;
  Json *source_local;
  Model *model_local;
  Unique<anurbs::Surface<3L>_> *result;
  
  geometry.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)source;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"geometry",&local_71);
  this_00 = nlohmann::
            basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::at(source,&local_70);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_50,this_00);
  Model::get_lazy<anurbs::NurbsSurfaceGeometry<3l>>((Model *)local_30,(string *)model);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  new_<anurbs::Surface<3l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>>,anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>const&>
            ((anurbs *)this,(Ref<anurbs::NurbsSurfaceGeometry<3L>_> *)local_30);
  Ref<anurbs::NurbsSurfaceGeometry<3L>_>::~Ref((Ref<anurbs::NurbsSurfaceGeometry<3L>_> *)local_30);
  return (__uniq_ptr_data<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>,_std::default_delete<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>,_std::default_delete<anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>_>,_true,_true>
            )this;
}

Assistant:

static Unique<Type> load(Model& model, const Json& source)
    {
        const auto geometry = model.get_lazy<NurbsSurfaceGeometry<TDimension>>(
            source.at("geometry"));

        auto result = new_<Type>(geometry);

        return result;
    }